

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O3

void __thiscall bloaty::dwarf::LineInfoReader::Advance(LineInfoReader *this,uint64_t amount)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(this->params_).maximum_operations_per_instruction;
  uVar1 = (this->info_).op_index + amount;
  uVar2 = (ulong)(this->params_).minimum_instruction_length;
  if (uVar4 == 1) {
    (this->info_).address = (this->info_).address + uVar1 * uVar2;
    uVar3 = '\0';
  }
  else {
    uVar3 = (uint8_t)(uVar1 % uVar4);
    (this->info_).address = (this->info_).address + (uVar1 / uVar4) * uVar2;
  }
  (this->info_).op_index = uVar3;
  return;
}

Assistant:

void LineInfoReader::Advance(uint64_t amount) {
  if (params_.maximum_operations_per_instruction == 1) {
    // This is by far the common case (only false on VLIW architectuers),
    // and this inlining/specialization avoids a costly division.
    DoAdvance(amount, 1);
  } else {
    DoAdvance(amount, params_.maximum_operations_per_instruction);
  }
}